

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

char * archive_read_disk_uname(archive *_a,int64_t uid)

{
  long lVar1;
  int iVar2;
  archive_read_disk *a;
  int64_t uid_local;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_uname");
  if (iVar2 == 0) {
    lVar1._0_4_ = _a[1].current_codepage;
    lVar1._4_4_ = _a[1].current_oemcp;
    if (lVar1 == 0) {
      _a_local = (archive *)0x0;
    }
    else {
      _a_local = (archive *)(**(code **)&_a[1].current_codepage)(_a[1].read_data_block,uid);
    }
  }
  else {
    _a_local = (archive *)0x0;
  }
  return (char *)_a_local;
}

Assistant:

const char *
archive_read_disk_uname(struct archive *_a, int64_t uid)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	if (ARCHIVE_OK != __archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
		ARCHIVE_STATE_ANY, "archive_read_disk_uname"))
		return (NULL);
	if (a->lookup_uname == NULL)
		return (NULL);
	return ((*a->lookup_uname)(a->lookup_uname_data, uid));
}